

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O2

int pr_cust(customer_t *c,int mode)

{
  int in_ECX;
  int in_R8D;
  
  if (pr_cust::fp == (FILE *)0x0) {
    pr_cust::fp = print_prep(3,0);
  }
  dbg_print(3,pr_cust::fp,c,in_ECX,in_R8D);
  dbg_print(0,pr_cust::fp,c->name,in_ECX,in_R8D);
  dbg_print(0,pr_cust::fp,c->address,in_ECX,in_R8D);
  dbg_print(3,pr_cust::fp,&c->nation_code,in_ECX,in_R8D);
  dbg_print(0,pr_cust::fp,c->phone,in_ECX,in_R8D);
  dbg_print(5,pr_cust::fp,&c->acctbal,in_ECX,in_R8D);
  dbg_print(0,pr_cust::fp,c->mktsegment,in_ECX,in_R8D);
  dbg_print(0,pr_cust::fp,c->comment,in_ECX,in_R8D);
  fputc(10,(FILE *)pr_cust::fp);
  return 0;
}

Assistant:

int
pr_cust(customer_t *c, int mode)
{
   static FILE *fp = NULL;
   UNUSED(mode);
        
   if (fp == NULL)
        fp = print_prep(CUST, 0);

   PR_STRT(fp);
   PR_HUGE(fp, &c->custkey);
   if (scale <= 3000)
   PR_VSTR(fp, c->name, C_NAME_LEN);
   else
   PR_VSTR(fp, c->name, C_NAME_LEN + 3);
   PR_VSTR(fp, c->address, c->alen);
   PR_HUGE(fp, &c->nation_code);
   PR_STR(fp, c->phone, PHONE_LEN);
   PR_MONEY(fp, &c->acctbal);
   PR_STR(fp, c->mktsegment, C_MSEG_LEN);
   PR_VSTR_LAST(fp, c->comment, c->clen);
   PR_END(fp);

   return(0);
}